

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCreateMffc(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,char *pNodeName)

{
  int *piVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *vCone;
  void **ppvVar6;
  Vec_Ptr_t *vSupp;
  Abc_Obj_t *pAVar7;
  long lVar8;
  long lVar9;
  char Buffer [1000];
  char local_418 [1000];
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x439,"Abc_Ntk_t *Abc_NtkCreateMffc(Abc_Ntk_t *, Abc_Obj_t *, char *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
    sprintf(local_418,"%s_%s",pNtk->pName,pNodeName);
    pcVar3 = Extra_UtilStrsav(local_418);
    pNtk_00->pName = pcVar3;
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      pAVar4 = Abc_AigConst1(pNtk_00);
      pAVar5 = Abc_AigConst1(pNtk);
      (pAVar5->field_6).pCopy = pAVar4;
    }
    vCone = (Vec_Ptr_t *)malloc(0x10);
    vCone->nCap = 100;
    vCone->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    vCone->pArray = ppvVar6;
    vSupp = (Vec_Ptr_t *)malloc(0x10);
    vSupp->nCap = 100;
    vSupp->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    vSupp->pArray = ppvVar6;
    Abc_NodeDeref_rec(pNode);
    Abc_NodeMffcConeSupp(pNode,vCone,vSupp);
    Abc_NodeRef_rec(pNode);
    if (0 < vSupp->nSize) {
      lVar8 = 0;
      do {
        pAVar4 = (Abc_Obj_t *)vSupp->pArray[lVar8];
        pAVar5 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
        (pAVar4->field_6).pCopy = pAVar5;
        pcVar3 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar5,pcVar3,(char *)0x0);
        lVar8 = lVar8 + 1;
      } while (lVar8 < vSupp->nSize);
    }
    pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
    Abc_ObjAssignName(pAVar4,pNodeName,(char *)0x0);
    if (0 < vCone->nSize) {
      lVar8 = 0;
      do {
        pAVar5 = (Abc_Obj_t *)vCone->pArray[lVar8];
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          piVar1 = (pAVar5->vFanins).pArray;
          ppvVar6 = pAVar5->pNtk->vObjs->pArray;
          pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^
                              *(ulong *)((long)ppvVar6[*piVar1] + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)&pAVar5->field_0x14 >> 0xb & 1) ^
                              *(ulong *)((long)ppvVar6[piVar1[1]] + 0x40)));
          (pAVar5->field_6).pCopy = pAVar7;
        }
        else {
          Abc_NtkDupObj(pNtk_00,pAVar5,0);
          if (0 < (pAVar5->vFanins).nSize) {
            lVar9 = 0;
            do {
              Abc_ObjAddFanin((pAVar5->field_6).pCopy,
                              *(Abc_Obj_t **)
                               ((long)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar9]] +
                               0x40));
              lVar9 = lVar9 + 1;
            } while (lVar9 < (pAVar5->vFanins).nSize);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vCone->nSize);
    }
    Abc_ObjAddFanin(pAVar4,(pNode->field_6).pCopy);
    if (vCone->pArray != (void **)0x0) {
      free(vCone->pArray);
    }
    free(vCone);
    if (vSupp->pArray != (void **)0x0) {
      free(vSupp->pArray);
    }
    free(vSupp);
    iVar2 = Abc_NtkCheck(pNtk_00);
    if (iVar2 == 0) {
      fwrite("Abc_NtkCreateMffc(): Network check has failed.\n",0x2f,1,_stdout);
    }
    return pNtk_00;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                ,0x43a,"Abc_Ntk_t *Abc_NtkCreateMffc(Abc_Ntk_t *, Abc_Obj_t *, char *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateMffc( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, char * pNodeName )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    Vec_Ptr_t * vCone, * vSupp;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_%s", pNtk->pName, pNodeName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in MFFC
    vCone = Vec_PtrAlloc( 100 );
    vSupp = Vec_PtrAlloc( 100 );
    Abc_NodeDeref_rec( pNode );
    Abc_NodeMffcConeSupp( pNode, vCone, vSupp );
    Abc_NodeRef_rec( pNode );
    // create the PIs
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // create the PO
    pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAssignName( pNodeCoNew, pNodeName, NULL );
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    // connect the topmost node
    Abc_ObjAddFanin( pNodeCoNew, pNode->pCopy );
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSupp );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateMffc(): Network check has failed.\n" );
    return pNtkNew;
}